

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int windowCodeOp(WindowCodeArg *p,int op,int regCountdown,int jumpOnEof)

{
  u8 uVar1;
  u8 uVar2;
  byte bVar3;
  int nReg;
  Parse *pParse;
  Window *pMWin;
  Vdbe *p_00;
  int iVar4;
  int reg;
  int iVar5;
  int iVar6;
  int p2;
  int iVar7;
  int *piVar8;
  int local_44;
  int local_40;
  
  pParse = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  uVar1 = pMWin->eFrmType;
  p2 = pParse->nLabel + -1;
  pParse->nLabel = p2;
  if ((op == 2) && (pMWin->eStart == 'Z')) {
    return 0;
  }
  local_40 = 0;
  if (regCountdown < 1) {
LAB_0018b711:
    if ((op == 1) && (pMWin->regStartRowid == 0)) {
      windowAggFinal((WindowCodeArg *)p->pParse,(int)p->pMWin);
    }
  }
  else {
    if (uVar1 != 'Y') {
      sqlite3VdbeAddOp3(p_00,0x31,regCountdown,p2,1);
      goto LAB_0018b711;
    }
    local_40 = p_00->nOp;
    if (op != 2) {
      windowCodeRangeTest(p,0x36,(p->end).csr,regCountdown,(p->current).csr,p2);
      goto LAB_0018b711;
    }
    if (pMWin->eStart == 'V') {
      iVar6 = (p->start).csr;
      iVar5 = (p->current).csr;
      iVar7 = 0x37;
    }
    else {
      iVar5 = (p->start).csr;
      iVar6 = (p->current).csr;
      iVar7 = 0x39;
    }
    windowCodeRangeTest(p,iVar7,iVar5,regCountdown,iVar6,p2);
  }
  iVar5 = p_00->nOp;
  if (((regCountdown != 0) && (pMWin->eStart == pMWin->eEnd)) && (pMWin->eFrmType == 'Y')) {
    uVar2 = pParse->nTempReg;
    if (uVar2 == '\0') {
      iVar6 = pParse->nMem + 1;
      iVar7 = iVar6;
LAB_0018b7b7:
      iVar7 = iVar7 + 1;
      pParse->nMem = iVar7;
    }
    else {
      bVar3 = uVar2 - 1;
      pParse->nTempReg = bVar3;
      iVar6 = pParse->aTempReg[bVar3];
      if (bVar3 == 0) {
        iVar7 = pParse->nMem;
        goto LAB_0018b7b7;
      }
      pParse->nTempReg = uVar2 - 2;
      iVar7 = pParse->aTempReg[(byte)(uVar2 - 2)];
    }
    if (op == 2) {
      sqlite3VdbeAddOp3(p_00,0x87,(p->start).csr,iVar6,0);
      sqlite3VdbeAddOp3(p_00,0x87,(p->end).csr,iVar7,0);
      iVar4 = iVar7;
LAB_0018b815:
      sqlite3VdbeAddOp3(p_00,0x39,iVar4,p2,iVar6);
    }
    else if (p->regRowid != 0) {
      sqlite3VdbeAddOp3(p_00,0x87,(p->end).csr,iVar6,0);
      iVar4 = p->regRowid;
      goto LAB_0018b815;
    }
    if (iVar6 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar6;
      }
    }
    if (iVar7 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar7;
      }
    }
  }
  if (op == 2) {
    iVar6 = (p->start).csr;
    local_44 = (p->start).reg;
    iVar7 = pMWin->regStartRowid;
    if (iVar7 != 0) goto LAB_0018b8dd;
    iVar7 = p->regArg;
    iVar4 = 1;
LAB_0018b900:
    windowAggStep(p,pMWin,iVar6,iVar4,iVar7);
  }
  else if (op == 1) {
    iVar6 = (p->current).csr;
    local_44 = (p->current).reg;
    windowReturnOneRow(p);
  }
  else {
    iVar6 = (p->end).csr;
    local_44 = (p->end).reg;
    if (pMWin->regStartRowid == 0) {
      iVar7 = p->regArg;
      iVar4 = 0;
      goto LAB_0018b900;
    }
    iVar7 = pMWin->regEndRowid;
LAB_0018b8dd:
    sqlite3VdbeAddOp3(p_00,0x56,iVar7,1,0);
  }
  if (p->eDelete == op) {
    sqlite3VdbeAddOp3(p_00,0x82,iVar6,0,0);
    iVar7 = p_00->nOp;
    if (0 < (long)iVar7) {
      p_00->aOp[(long)iVar7 + -1].p5 = 2;
    }
  }
  else {
    iVar7 = p_00->nOp;
  }
  if (jumpOnEof == 0) {
    iVar4 = 0;
    sqlite3VdbeAddOp3(p_00,0x26,iVar6,(iVar7 - (uint)(uVar1 == 'L')) + 2,0);
    if (uVar1 == 'L') goto LAB_0018ba8a;
    iVar4 = 0;
    sqlite3VdbeAddOp3(p_00,8,0,p2,0);
  }
  else {
    sqlite3VdbeAddOp3(p_00,0x26,iVar6,iVar7 + 2,0);
    iVar4 = sqlite3VdbeAddOp3(p_00,8,0,0,0);
    if (uVar1 == 'L') goto LAB_0018ba8a;
  }
  iVar7 = 0;
  if (pMWin->pOrderBy == (ExprList *)0x0) {
    reg = 0;
  }
  else {
    nReg = pMWin->pOrderBy->nExpr;
    reg = 0;
    if (nReg != 0) {
      reg = sqlite3GetTempRange(pParse,nReg);
      iVar7 = nReg;
    }
  }
  windowReadPeerValues(p,iVar6,reg);
  windowIfNewPeer(pParse,pMWin->pOrderBy,reg,local_44,iVar5);
  if (iVar7 == 1) {
    if (reg == 0) goto LAB_0018ba8a;
    bVar3 = pParse->nTempReg;
    if (7 < (ulong)bVar3) goto LAB_0018ba8a;
    pParse->nTempReg = bVar3 + 1;
    piVar8 = pParse->aTempReg + bVar3;
  }
  else {
    if (iVar7 <= pParse->nRangeReg) goto LAB_0018ba8a;
    pParse->nRangeReg = iVar7;
    piVar8 = &pParse->iRangeReg;
  }
  *piVar8 = reg;
LAB_0018ba8a:
  if (local_40 != 0) {
    sqlite3VdbeAddOp3(p_00,8,0,local_40,0);
  }
  sqlite3VdbeResolveLabel(p_00,p2);
  return iVar4;
}

Assistant:

static int windowCodeOp(
 WindowCodeArg *p,                /* Context object */
 int op,                          /* WINDOW_RETURN_ROW, AGGSTEP or AGGINVERSE */
 int regCountdown,                /* Register for OP_IfPos countdown */
 int jumpOnEof                    /* Jump here if stepped cursor reaches EOF */
){
  int csr, reg;
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  int ret = 0;
  Vdbe *v = p->pVdbe;
  int addrContinue = 0;
  int bPeer = (pMWin->eFrmType!=TK_ROWS);

  int lblDone = sqlite3VdbeMakeLabel(pParse);
  int addrNextRange = 0;

  /* Special case - WINDOW_AGGINVERSE is always a no-op if the frame
  ** starts with UNBOUNDED PRECEDING. */
  if( op==WINDOW_AGGINVERSE && pMWin->eStart==TK_UNBOUNDED ){
    assert( regCountdown==0 && jumpOnEof==0 );
    return 0;
  }

  if( regCountdown>0 ){
    if( pMWin->eFrmType==TK_RANGE ){
      addrNextRange = sqlite3VdbeCurrentAddr(v);
      assert( op==WINDOW_AGGINVERSE || op==WINDOW_AGGSTEP );
      if( op==WINDOW_AGGINVERSE ){
        if( pMWin->eStart==TK_FOLLOWING ){
          windowCodeRangeTest(
              p, OP_Le, p->current.csr, regCountdown, p->start.csr, lblDone
          );
        }else{
          windowCodeRangeTest(
              p, OP_Ge, p->start.csr, regCountdown, p->current.csr, lblDone
          );
        }
      }else{
        windowCodeRangeTest(
            p, OP_Gt, p->end.csr, regCountdown, p->current.csr, lblDone
        );
      }
    }else{
      sqlite3VdbeAddOp3(v, OP_IfPos, regCountdown, lblDone, 1);
      VdbeCoverage(v);
    }
  }

  if( op==WINDOW_RETURN_ROW && pMWin->regStartRowid==0 ){
    windowAggFinal(p, 0);
  }
  addrContinue = sqlite3VdbeCurrentAddr(v);

  /* If this is a (RANGE BETWEEN a FOLLOWING AND b FOLLOWING) or
  ** (RANGE BETWEEN b PRECEDING AND a PRECEDING) frame, ensure the
  ** start cursor does not advance past the end cursor within the
  ** temporary table. It otherwise might, if (a>b). Also ensure that,
  ** if the input cursor is still finding new rows, that the end
  ** cursor does not go past it to EOF. */
  if( pMWin->eStart==pMWin->eEnd && regCountdown
   && pMWin->eFrmType==TK_RANGE
  ){
    int regRowid1 = sqlite3GetTempReg(pParse);
    int regRowid2 = sqlite3GetTempReg(pParse);
    if( op==WINDOW_AGGINVERSE ){
      sqlite3VdbeAddOp2(v, OP_Rowid, p->start.csr, regRowid1);
      sqlite3VdbeAddOp2(v, OP_Rowid, p->end.csr, regRowid2);
      sqlite3VdbeAddOp3(v, OP_Ge, regRowid2, lblDone, regRowid1);
      VdbeCoverage(v);
    }else if( p->regRowid ){
      sqlite3VdbeAddOp2(v, OP_Rowid, p->end.csr, regRowid1);
      sqlite3VdbeAddOp3(v, OP_Ge, p->regRowid, lblDone, regRowid1);
      VdbeCoverageNeverNull(v);
    }
    sqlite3ReleaseTempReg(pParse, regRowid1);
    sqlite3ReleaseTempReg(pParse, regRowid2);
    assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING );
  }

  switch( op ){
    case WINDOW_RETURN_ROW:
      csr = p->current.csr;
      reg = p->current.reg;
      windowReturnOneRow(p);
      break;

    case WINDOW_AGGINVERSE:
      csr = p->start.csr;
      reg = p->start.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regStartRowid, 1);
      }else{
        windowAggStep(p, pMWin, csr, 1, p->regArg);
      }
      break;

    default:
      assert( op==WINDOW_AGGSTEP );
      csr = p->end.csr;
      reg = p->end.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regEndRowid, 1);
      }else{
        windowAggStep(p, pMWin, csr, 0, p->regArg);
      }
      break;
  }

  if( op==p->eDelete ){
    sqlite3VdbeAddOp1(v, OP_Delete, csr);
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);
  }

  if( jumpOnEof ){
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    ret = sqlite3VdbeAddOp0(v, OP_Goto);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+1+bPeer);
    VdbeCoverage(v);
    if( bPeer ){
      sqlite3VdbeAddOp2(v, OP_Goto, 0, lblDone);
    }
  }

  if( bPeer ){
    int nReg = (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);
    int regTmp = (nReg ? sqlite3GetTempRange(pParse, nReg) : 0);
    windowReadPeerValues(p, csr, regTmp);
    windowIfNewPeer(pParse, pMWin->pOrderBy, regTmp, reg, addrContinue);
    sqlite3ReleaseTempRange(pParse, regTmp, nReg);
  }

  if( addrNextRange ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNextRange);
  }
  sqlite3VdbeResolveLabel(v, lblDone);
  return ret;
}